

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O1

void __thiscall CVmPackType::CVmPackType(CVmPackType *this,CVmPackGroup *g)

{
  (this->lit).idx = 0;
  (this->lit).p.p_ = (char *)0x0;
  (this->lit).len = 0;
  this->type_code = L'\0';
  this->count = -1;
  this->count_in_bytes = 0;
  this->count_as_type = L'\0';
  this->bang = 0;
  this->qu = 0;
  this->null_term = 0;
  this->big_endian = g->big_endian;
  this->tilde = g->tilde;
  this->pct = g->pct;
  return;
}

Assistant:

CVmPackType::CVmPackType(const CVmPackGroup *g)
{
    /* clear the type code and count */
    type_code = 0;
    count = ITER_NONE;
    count_as_type = 0;
    count_in_bytes = FALSE;
    bang = FALSE;
    qu = FALSE;
    null_term = FALSE;

    /* inherit group attributes */
    big_endian = g->big_endian;
    tilde = g->tilde;
    pct = g->pct;
}